

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O0

void __thiscall
mjs::bound_function_args::bound_function_args
          (bound_function_args *this,gc_heap *h,
          vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *pgVar1;
  uint uVar2;
  bool bVar3;
  const_reference pvVar4;
  size_type sVar5;
  gc_vector<mjs::value_representation> *pgVar6;
  value_representation local_70;
  uint local_64;
  undefined1 auStack_60 [4];
  uint32_t i;
  gc_vector<mjs::value_representation> a;
  undefined1 local_40 [20];
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>,_true> local_2c;
  value_representation local_28;
  vector<mjs::value,_std::allocator<mjs::value>_> *local_20;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  gc_heap *h_local;
  bound_function_args *this_local;
  
  this->heap_ = h;
  local_20 = args;
  args_local = (vector<mjs::value,_std::allocator<mjs::value>_> *)h;
  h_local = (gc_heap *)this;
  value_representation::value_representation(&this->bound_this_,(value *)value::undefined);
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>,_true>::gc_heap_ptr_untracked
            (&this->bound_args_,(nullptr_t)0x0);
  bVar3 = std::vector<mjs::value,_std::allocator<mjs::value>_>::empty(local_20);
  if (!bVar3) {
    pvVar4 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](local_20,0);
    value_representation::value_representation(&local_28,pvVar4);
    (this->bound_this_).repr_ = local_28.repr_;
    sVar5 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size(local_20);
    if (1 < sVar5) {
      pgVar1 = this->heap_;
      std::vector<mjs::value,_std::allocator<mjs::value>_>::size(local_20);
      gc_vector<mjs::value_representation>::make((gc_heap *)local_40,(uint32_t)pgVar1);
      gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>,_true>::gc_heap_ptr_untracked
                (&local_2c,(gc_heap_ptr<mjs::gc_vector<mjs::value_representation>_> *)local_40);
      (this->bound_args_).pos_ = local_2c.pos_;
      gc_heap_ptr<mjs::gc_vector<mjs::value_representation>_>::~gc_heap_ptr
                ((gc_heap_ptr<mjs::gc_vector<mjs::value_representation>_> *)local_40);
      pgVar6 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>,_true>::dereference
                         (&this->bound_args_,this->heap_);
      _auStack_60 = pgVar6->heap_;
      a.heap_ = *(gc_heap **)&pgVar6->table_;
      for (local_64 = 1; uVar2 = local_64,
          sVar5 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size(local_20),
          uVar2 < (uint)sVar5; local_64 = local_64 + 1) {
        pvVar4 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[]
                           (local_20,(ulong)local_64);
        value_representation::value_representation(&local_70,pvVar4);
        gc_vector<mjs::value_representation>::push_back
                  ((gc_vector<mjs::value_representation> *)auStack_60,&local_70);
      }
    }
  }
  return;
}

Assistant:

explicit bound_function_args(gc_heap& h, const std::vector<value>& args)
        : heap_{h}
        , bound_this_{value::undefined}
        , bound_args_{nullptr} {
        if (!args.empty()) {
            bound_this_ = value_representation{args[0]};
            if (args.size() > 1) {
                bound_args_ =  gc_vector<value_representation>::make(heap_, static_cast<uint32_t>(args.size() - 1));
                auto a = bound_args_.dereference(heap_);
                for (uint32_t i = 1; i < static_cast<uint32_t>(args.size()); ++i) {
                    a.push_back(value_representation{args[i]});
                }
            }
        }
    }